

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  EnumValueDescriptorProto *pEVar5;
  EnumOptions *pEVar6;
  LogMessage *other;
  string *psVar7;
  mapped_type *pmVar8;
  long lVar9;
  int local_158;
  LogFinisher local_151;
  LogMessage local_150;
  int local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string error;
  int local_84;
  _Self local_80;
  EnumValueDescriptor *local_78;
  EnumValueDescriptor *enum_value;
  int local_5c;
  undefined1 local_58 [4];
  int i_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  int i;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enm_local;
  DescriptorBuilder *this_local;
  
  for (used_values._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      iVar2 = used_values._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
      iVar4 = EnumDescriptor::value_count(enm), iVar2 < iVar4;
      used_values._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           used_values._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    lVar1 = *(long *)(enm + 0x30);
    lVar9 = (long)used_values._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    pEVar5 = EnumDescriptorProto::value
                       (proto,used_values._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    ValidateEnumValueOptions(this,(EnumValueDescriptor *)(lVar1 + lVar9 * 0x28),pEVar5);
  }
  pEVar6 = EnumDescriptor::options(enm);
  bVar3 = EnumOptions::has_allow_alias(pEVar6);
  if (bVar3) {
    pEVar6 = EnumDescriptor::options(enm);
    bVar3 = EnumOptions::allow_alias(pEVar6);
    if (bVar3) {
      return;
    }
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_58);
  for (local_5c = 0; iVar2 = local_5c, iVar4 = EnumDescriptor::value_count(enm), iVar2 < iVar4;
      local_5c = local_5c + 1) {
    local_78 = EnumDescriptor::value(enm,local_5c);
    local_84 = EnumValueDescriptor::number(local_78);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_58,&local_84);
    error.field_2._8_8_ =
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_58);
    bVar3 = std::operator!=(&local_80,(_Self *)((long)&error.field_2 + 8));
    if (bVar3) {
      psVar7 = EnumValueDescriptor::full_name_abi_cxx11_(local_78);
      std::operator+(&local_110,"\"",psVar7);
      std::operator+(&local_f0,&local_110,"\" uses the same enum value as \"");
      local_114 = EnumValueDescriptor::number(local_78);
      pmVar8 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_58,&local_114);
      std::operator+(&local_d0,&local_f0,pmVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_d0,
                     "\". If this is intended, set \'option allow_alias = true;\' to the enum definition."
                    );
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      pEVar6 = EnumDescriptor::options(enm);
      bVar3 = EnumOptions::allow_alias(pEVar6);
      if (bVar3) {
        internal::LogMessage::LogMessage
                  (&local_150,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1680);
        other = internal::LogMessage::operator<<(&local_150,(string *)local_b0);
        internal::LogFinisher::operator=(&local_151,other);
        internal::LogMessage::~LogMessage(&local_150);
      }
      else {
        psVar7 = EnumDescriptor::full_name_abi_cxx11_(enm);
        AddError(this,psVar7,&proto->super_Message,NUMBER,(string *)local_b0);
      }
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      psVar7 = EnumValueDescriptor::full_name_abi_cxx11_(local_78);
      local_158 = EnumValueDescriptor::number(local_78);
      pmVar8 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_58,&local_158);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)psVar7);
    }
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_58);
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] + "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER,
                   error);
        } else {
          // Generate warning if duplicated values are found but the option
          // isn't set.
          GOOGLE_LOG(ERROR) << error;
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}